

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.h
# Opt level: O0

void comp_mask_pred_16_ssse3(uint8_t *src0,uint8_t *src1,uint8_t *mask,uint8_t *dst)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  __m128i maA;
  __m128i aA;
  __m128i sA1;
  __m128i sA0;
  __m128i round_offset;
  __m128i alpha_max;
  undefined1 local_188;
  undefined1 uStack_187;
  undefined1 uStack_186;
  undefined1 uStack_185;
  undefined1 uStack_184;
  undefined1 uStack_183;
  undefined1 uStack_182;
  undefined1 uStack_181;
  undefined1 local_178;
  undefined1 uStack_177;
  undefined1 uStack_176;
  undefined1 uStack_175;
  undefined1 uStack_174;
  undefined1 uStack_173;
  undefined1 uStack_172;
  undefined1 uStack_171;
  undefined1 uStack_100;
  undefined1 uStack_ff;
  undefined1 uStack_fe;
  undefined1 uStack_fd;
  undefined1 uStack_fc;
  undefined1 uStack_fb;
  undefined1 uStack_fa;
  undefined1 uStack_f9;
  undefined1 uStack_f0;
  undefined1 uStack_ef;
  undefined1 uStack_ee;
  undefined1 uStack_ed;
  undefined1 uStack_ec;
  undefined1 uStack_eb;
  undefined1 uStack_ea;
  undefined1 uStack_e9;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  char local_b8;
  char cStack_b7;
  char cStack_b6;
  char cStack_b5;
  char cStack_b4;
  char cStack_b3;
  char cStack_b2;
  char cStack_b1;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  char cStack_ad;
  char cStack_ac;
  char cStack_ab;
  char cStack_aa;
  char cStack_a9;
  __m128i roundAH;
  __m128i roundAL;
  __m128i blendAH;
  __m128i blendAL;
  __m128i aaAH;
  __m128i ssAH;
  __m128i aaAL;
  __m128i ssAL;
  
  auVar8._8_8_ = 0x200020002000200;
  auVar8._0_8_ = 0x200020002000200;
  auVar8 = lddqu(auVar8,*in_RDI);
  auVar9 = lddqu(auVar8,*in_RSI);
  uVar1 = *in_RDX;
  uVar2 = in_RDX[1];
  local_b8 = (char)uVar1;
  cStack_b7 = (char)((ulong)uVar1 >> 8);
  cStack_b6 = (char)((ulong)uVar1 >> 0x10);
  cStack_b5 = (char)((ulong)uVar1 >> 0x18);
  cStack_b4 = (char)((ulong)uVar1 >> 0x20);
  cStack_b3 = (char)((ulong)uVar1 >> 0x28);
  cStack_b2 = (char)((ulong)uVar1 >> 0x30);
  cStack_b1 = (char)((ulong)uVar1 >> 0x38);
  cStack_b0 = (char)uVar2;
  cStack_af = (char)((ulong)uVar2 >> 8);
  cStack_ae = (char)((ulong)uVar2 >> 0x10);
  cStack_ad = (char)((ulong)uVar2 >> 0x18);
  cStack_ac = (char)((ulong)uVar2 >> 0x20);
  cStack_ab = (char)((ulong)uVar2 >> 0x28);
  cStack_aa = (char)((ulong)uVar2 >> 0x30);
  cStack_a9 = (char)((ulong)uVar2 >> 0x38);
  local_178 = auVar8[0];
  uStack_177 = auVar8[1];
  uStack_176 = auVar8[2];
  uStack_175 = auVar8[3];
  uStack_174 = auVar8[4];
  uStack_173 = auVar8[5];
  uStack_172 = auVar8[6];
  uStack_171 = auVar8[7];
  local_188 = auVar9[0];
  uStack_187 = auVar9[1];
  uStack_186 = auVar9[2];
  uStack_185 = auVar9[3];
  uStack_184 = auVar9[4];
  uStack_183 = auVar9[5];
  uStack_182 = auVar9[6];
  uStack_181 = auVar9[7];
  uStack_f0 = auVar8[8];
  uStack_ef = auVar8[9];
  uStack_ee = auVar8[10];
  uStack_ed = auVar8[0xb];
  uStack_ec = auVar8[0xc];
  uStack_eb = auVar8[0xd];
  uStack_ea = auVar8[0xe];
  uStack_e9 = auVar8[0xf];
  uStack_100 = auVar9[8];
  uStack_ff = auVar9[9];
  uStack_fe = auVar9[10];
  uStack_fd = auVar9[0xb];
  uStack_fc = auVar9[0xc];
  uStack_fb = auVar9[0xd];
  uStack_fa = auVar9[0xe];
  uStack_f9 = auVar9[0xf];
  auVar5[1] = local_188;
  auVar5[0] = local_178;
  auVar5[2] = uStack_177;
  auVar5[3] = uStack_187;
  auVar5[4] = uStack_176;
  auVar5[5] = uStack_186;
  auVar5[6] = uStack_175;
  auVar5[7] = uStack_185;
  auVar5[9] = uStack_184;
  auVar5[8] = uStack_174;
  auVar5[10] = uStack_173;
  auVar5[0xb] = uStack_183;
  auVar5[0xc] = uStack_172;
  auVar5[0xd] = uStack_182;
  auVar5[0xe] = uStack_171;
  auVar5[0xf] = uStack_181;
  auVar4[1] = '@' - local_b8;
  auVar4[0] = local_b8;
  auVar4[2] = cStack_b7;
  auVar4[3] = '@' - cStack_b7;
  auVar4[4] = cStack_b6;
  auVar4[5] = '@' - cStack_b6;
  auVar4[6] = cStack_b5;
  auVar4[7] = '@' - cStack_b5;
  auVar4[9] = '@' - cStack_b4;
  auVar4[8] = cStack_b4;
  auVar4[10] = cStack_b3;
  auVar4[0xb] = '@' - cStack_b3;
  auVar4[0xc] = cStack_b2;
  auVar4[0xd] = '@' - cStack_b2;
  auVar4[0xe] = cStack_b1;
  auVar4[0xf] = '@' - cStack_b1;
  auVar8 = pmaddubsw(auVar5,auVar4);
  auVar3[1] = uStack_100;
  auVar3[0] = uStack_f0;
  auVar3[2] = uStack_ef;
  auVar3[3] = uStack_ff;
  auVar3[4] = uStack_ee;
  auVar3[5] = uStack_fe;
  auVar3[6] = uStack_ed;
  auVar3[7] = uStack_fd;
  auVar3[9] = uStack_fc;
  auVar3[8] = uStack_ec;
  auVar3[10] = uStack_eb;
  auVar3[0xb] = uStack_fb;
  auVar3[0xc] = uStack_ea;
  auVar3[0xd] = uStack_fa;
  auVar3[0xe] = uStack_e9;
  auVar3[0xf] = uStack_f9;
  auVar9[1] = '@' - cStack_b0;
  auVar9[0] = cStack_b0;
  auVar9[2] = cStack_af;
  auVar9[3] = '@' - cStack_af;
  auVar9[4] = cStack_ae;
  auVar9[5] = '@' - cStack_ae;
  auVar9[6] = cStack_ad;
  auVar9[7] = '@' - cStack_ad;
  auVar9[9] = '@' - cStack_ac;
  auVar9[8] = cStack_ac;
  auVar9[10] = cStack_ab;
  auVar9[0xb] = '@' - cStack_ab;
  auVar9[0xc] = cStack_aa;
  auVar9[0xd] = '@' - cStack_aa;
  auVar9[0xe] = cStack_a9;
  auVar9[0xf] = '@' - cStack_a9;
  auVar9 = pmaddubsw(auVar3,auVar9);
  auVar7._8_8_ = 0x200020002000200;
  auVar7._0_8_ = 0x200020002000200;
  auVar8 = pmulhrsw(auVar8,auVar7);
  auVar6._8_8_ = 0x200020002000200;
  auVar6._0_8_ = 0x200020002000200;
  auVar9 = pmulhrsw(auVar9,auVar6);
  local_d8 = auVar8._0_2_;
  sStack_d6 = auVar8._2_2_;
  sStack_d4 = auVar8._4_2_;
  sStack_d2 = auVar8._6_2_;
  sStack_d0 = auVar8._8_2_;
  sStack_ce = auVar8._10_2_;
  sStack_cc = auVar8._12_2_;
  sStack_ca = auVar8._14_2_;
  local_e8 = auVar9._0_2_;
  sStack_e6 = auVar9._2_2_;
  sStack_e4 = auVar9._4_2_;
  sStack_e2 = auVar9._6_2_;
  sStack_e0 = auVar9._8_2_;
  sStack_de = auVar9._10_2_;
  sStack_dc = auVar9._12_2_;
  sStack_da = auVar9._14_2_;
  *in_RCX = CONCAT17((0 < sStack_ca) * (sStack_ca < 0x100) * auVar8[0xe] - (0xff < sStack_ca),
                     CONCAT16((0 < sStack_cc) * (sStack_cc < 0x100) * auVar8[0xc] -
                              (0xff < sStack_cc),
                              CONCAT15((0 < sStack_ce) * (sStack_ce < 0x100) * auVar8[10] -
                                       (0xff < sStack_ce),
                                       CONCAT14((0 < sStack_d0) * (sStack_d0 < 0x100) * auVar8[8] -
                                                (0xff < sStack_d0),
                                                CONCAT13((0 < sStack_d2) * (sStack_d2 < 0x100) *
                                                         auVar8[6] - (0xff < sStack_d2),
                                                         CONCAT12((0 < sStack_d4) *
                                                                  (sStack_d4 < 0x100) * auVar8[4] -
                                                                  (0xff < sStack_d4),
                                                                  CONCAT11((0 < sStack_d6) *
                                                                           (sStack_d6 < 0x100) *
                                                                           auVar8[2] -
                                                                           (0xff < sStack_d6),
                                                                           (0 < local_d8) *
                                                                           (local_d8 < 0x100) *
                                                                           auVar8[0] -
                                                                           (0xff < local_d8))))))));
  in_RCX[1] = CONCAT17((0 < sStack_da) * (sStack_da < 0x100) * auVar9[0xe] - (0xff < sStack_da),
                       CONCAT16((0 < sStack_dc) * (sStack_dc < 0x100) * auVar9[0xc] -
                                (0xff < sStack_dc),
                                CONCAT15((0 < sStack_de) * (sStack_de < 0x100) * auVar9[10] -
                                         (0xff < sStack_de),
                                         CONCAT14((0 < sStack_e0) * (sStack_e0 < 0x100) * auVar9[8]
                                                  - (0xff < sStack_e0),
                                                  CONCAT13((0 < sStack_e2) * (sStack_e2 < 0x100) *
                                                           auVar9[6] - (0xff < sStack_e2),
                                                           CONCAT12((0 < sStack_e4) *
                                                                    (sStack_e4 < 0x100) * auVar9[4]
                                                                    - (0xff < sStack_e4),
                                                                    CONCAT11((0 < sStack_e6) *
                                                                             (sStack_e6 < 0x100) *
                                                                             auVar9[2] -
                                                                             (0xff < sStack_e6),
                                                                             (0 < local_e8) *
                                                                             (local_e8 < 0x100) *
                                                                             auVar9[0] -
                                                                             (0xff < local_e8)))))))
                      );
  return;
}

Assistant:

static inline void comp_mask_pred_16_ssse3(const uint8_t *src0,
                                           const uint8_t *src1,
                                           const uint8_t *mask, uint8_t *dst) {
  const __m128i alpha_max = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i round_offset =
      _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));

  const __m128i sA0 = _mm_lddqu_si128((const __m128i *)(src0));
  const __m128i sA1 = _mm_lddqu_si128((const __m128i *)(src1));
  const __m128i aA = _mm_load_si128((const __m128i *)(mask));

  const __m128i maA = _mm_sub_epi8(alpha_max, aA);

  const __m128i ssAL = _mm_unpacklo_epi8(sA0, sA1);
  const __m128i aaAL = _mm_unpacklo_epi8(aA, maA);
  const __m128i ssAH = _mm_unpackhi_epi8(sA0, sA1);
  const __m128i aaAH = _mm_unpackhi_epi8(aA, maA);

  const __m128i blendAL = _mm_maddubs_epi16(ssAL, aaAL);
  const __m128i blendAH = _mm_maddubs_epi16(ssAH, aaAH);

  const __m128i roundAL = _mm_mulhrs_epi16(blendAL, round_offset);
  const __m128i roundAH = _mm_mulhrs_epi16(blendAH, round_offset);
  _mm_store_si128((__m128i *)dst, _mm_packus_epi16(roundAL, roundAH));
}